

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexical.cpp
# Opt level: O1

bool fs_is_safe_name(string_view filename)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  
  bVar1 = fs_is_reserved(filename);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    pcVar3 = filename._M_str + filename._M_len;
    pcVar2 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<bool(*)(char)>>
                       (filename._M_str,pcVar3,fs_is_safe_char);
    bVar1 = pcVar2 == pcVar3;
  }
  return bVar1;
}

Assistant:

bool
fs_is_safe_name(std::string_view filename)
{
  // check that only shell-safe characters are in filename
  // hasn't been fully tested yet across operating systems and file systems--let us know if character(s) should be unsafe
  // does NOT check for reserved or device names
  // => filenames only, not paths
  // https://learn.microsoft.com/en-us/windows/win32/fileio/naming-a-file
  // we do not consider whitespaces, quotes, or ticks safe, as they can be confusing in shell scripts and command line usage

  if(fs_is_reserved(filename))
    return false;

#ifdef __cpp_lib_ranges // C++20
  return std::ranges::all_of(filename, fs_is_safe_char);
#else // C++11
  return std::all_of(filename.begin(), filename.end(), fs_is_safe_char);
#endif
}